

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pshmod.c
# Opt level: O2

void ps_hinter_done(PS_Hinter_Module module)

{
  FT_Memory memory;
  
  (module->t1_funcs).hints = (T1_Hints)0x0;
  (module->t2_funcs).hints = (T2_Hints)0x0;
  memory = (module->ps_hints).memory;
  ps_dimension_done((module->ps_hints).dimension,memory);
  ps_dimension_done((module->ps_hints).dimension + 1,memory);
  (module->ps_hints).error = 0;
  (module->ps_hints).memory = (FT_Memory)0x0;
  return;
}

Assistant:

FT_CALLBACK_DEF( void )
  ps_hinter_done( PS_Hinter_Module  module )
  {
    module->t1_funcs.hints = NULL;
    module->t2_funcs.hints = NULL;

    ps_hints_done( &module->ps_hints );
  }